

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

shared_ptr<spdlog::async_logger>
spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>::
create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&>
          (string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,bool *args_1)

{
  bool bVar1;
  registry *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::async_logger> sVar2;
  shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> sink;
  shared_ptr<spdlog::details::thread_pool> tp;
  lock_guard<std::recursive_mutex> tp_lock;
  recursive_mutex *mutex;
  registry *registry_inst;
  shared_ptr<spdlog::async_logger> *new_logger;
  mutex_type *in_stack_ffffffffffffff08;
  shared_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff10;
  shared_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff18;
  registry *this_00;
  registry *in_stack_ffffffffffffff28;
  registry *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  element_type *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [20];
  undefined4 local_6c;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  __args = in_RDI;
  this = details::registry::instance();
  details::registry::tp_mutex(this);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
            );
  details::registry::get_tp(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    local_6c = 1;
    std::make_shared<spdlog::details::thread_pool,unsigned_long_const&,unsigned_int>
              ((unsigned_long *)in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
    this_00 = (registry *)&stack0xffffffffffffff98;
    std::shared_ptr<spdlog::details::thread_pool>::operator=
              (in_stack_ffffffffffffff10,
               (shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffff08);
    std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
              ((shared_ptr<spdlog::details::thread_pool> *)0x148373);
    in_stack_ffffffffffffff38 = local_80;
    in_stack_ffffffffffffff30 = this;
    std::shared_ptr<spdlog::details::thread_pool>::shared_ptr
              (in_stack_ffffffffffffff10,
               (shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffff08);
    details::registry::set_tp(this_00,in_stack_ffffffffffffff18);
    std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
              ((shared_ptr<spdlog::details::thread_pool> *)0x1483af);
  }
  std::make_shared<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&>
            (in_stack_ffffffffffffff38,(bool *)in_stack_ffffffffffffff30);
  std::
  make_shared<spdlog::async_logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>>,std::shared_ptr<spdlog::details::thread_pool>,spdlog::async_overflow_policy>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,in_RSI,
             (shared_ptr<spdlog::details::thread_pool> *)in_stack_ffffffffffffff38,
             (async_overflow_policy *)in_stack_ffffffffffffff30);
  std::shared_ptr<spdlog::logger>::shared_ptr<spdlog::async_logger,void>
            ((shared_ptr<spdlog::logger> *)this,
             (shared_ptr<spdlog::async_logger> *)in_stack_ffffffffffffff08);
  details::registry::initialize_logger
            ((registry *)in_stack_ffffffffffffffc0,
             (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffb8);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x14848e);
  std::shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::basic_file_sink<std::mutex>_> *)0x1484f0);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x1484fd);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x14850a);
  sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::async_logger>)
         sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<async_logger> create(std::string logger_name, SinkArgs &&...args)
    {
        auto &registry_inst = details::registry::instance();

        // create global thread pool if not already exists..

        auto &mutex = registry_inst.tp_mutex();
        std::lock_guard<std::recursive_mutex> tp_lock(mutex);
        auto tp = registry_inst.get_tp();
        if (tp == nullptr)
        {
            tp = std::make_shared<details::thread_pool>(details::default_async_q_size, 1U);
            registry_inst.set_tp(tp);
        }

        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<async_logger>(std::move(logger_name), std::move(sink), std::move(tp), OverflowPolicy);
        registry_inst.initialize_logger(new_logger);
        return new_logger;
    }